

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O0

void fdsocket_set_frozen(Socket *s,_Bool is_frozen)

{
  FdSocket *fds;
  _Bool is_frozen_local;
  Socket *s_local;
  
  if (-1 < *(int *)((long)&s[-0x412].vt + 4)) {
    if (is_frozen) {
      uxsel_del(*(int *)((long)&s[-0x412].vt + 4));
    }
    else {
      uxsel_set(*(int *)((long)&s[-0x412].vt + 4),1,fdsocket_select_result_input);
    }
  }
  return;
}

Assistant:

static void fdsocket_set_frozen(Socket *s, bool is_frozen)
{
    FdSocket *fds = container_of(s, FdSocket, sock);

    if (fds->infd < 0)
        return;

    if (is_frozen)
        uxsel_del(fds->infd);
    else
        uxsel_set(fds->infd, SELECT_R, fdsocket_select_result_input);
}